

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O1

void adt_list_insert(adt_list_t *self,void *pItem)

{
  adt_list_elem_t *paVar1;
  adt_list_elem_t *paVar2;
  adt_list_t *paVar3;
  
  if ((self != (adt_list_t *)0x0) &&
     (paVar1 = adt_list_elem_new(pItem,(adt_list_elem_t *)0x0,self->pLast),
     paVar1 != (adt_list_elem_t *)0x0)) {
    paVar3 = (adt_list_t *)&self->pLast;
    paVar2 = *(adt_list_elem_t **)paVar3;
    if ((paVar2 == (adt_list_elem_t *)0x0) &&
       (paVar2 = (adt_list_elem_t *)paVar3, paVar3 = self, self->pFirst != (adt_list_elem_t *)0x0))
    {
      __assert_fail("self->pFirst == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_list.c"
                    ,0x6f,"void adt_list_insert(adt_list_t *, void *)");
    }
    paVar2->pNext = paVar1;
    paVar3->pFirst = paVar1;
  }
  return;
}

Assistant:

void adt_list_insert(adt_list_t *self, void *pItem)
{
   if (self != 0)
   {
      adt_list_elem_t *elem = adt_list_elem_new(pItem,0,self->pLast);
      if (elem != 0)
      {
         if (self->pLast==0)
         {
            assert(self->pFirst == 0); //list must be empty if pLast is NULL
            self->pLast = elem;
            self->pFirst = elem;
         }
         else
         {
            self->pLast->pNext=elem;
            self->pLast=elem;
         }
      }
   }
}